

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  pointer pcVar1;
  void *pvVar2;
  void *data;
  uint8 *puVar3;
  Version *pVVar4;
  int iVar5;
  pointer ppFVar6;
  const_iterator cVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  long lVar9;
  pointer __old_p;
  ulong uVar10;
  size_t __n;
  bool bVar11;
  SubstituteArg *arg9;
  Subprocess subprocess;
  string communicate_error;
  string processed_parameter;
  CodedOutputStream writer;
  string local_2c0;
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ZeroCopyOutputStream *stream;
  
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  CodeGeneratorResponse::CodeGeneratorResponse(&response);
  processed_parameter._M_dataplus._M_p = (pointer)&processed_parameter.field_2;
  pcVar1 = (parameter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&processed_parameter,pcVar1,pcVar1 + parameter->_M_string_length);
  if (processed_parameter._M_string_length != 0) {
    request._has_bits_.has_bits_[0]._0_1_ = (byte)request._has_bits_.has_bits_[0] | 1;
    if (request.parameter_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&request.parameter_,&processed_parameter);
    }
    else {
      std::__cxx11::string::_M_assign((string *)request.parameter_.ptr_);
    }
  }
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_seen._M_t._M_impl.super__Rb_tree_header._M_header;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppFVar6 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
    uVar10 = 0;
    do {
      CodeGeneratorRequest::add_file_to_generate(&request,*(string **)ppFVar6[uVar10]);
      GetTransitiveDependencies
                ((parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar10],true,true,&already_seen,
                 &request.proto_file_);
      uVar10 = uVar10 + 1;
      ppFVar6 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3
                             ));
  }
  request._has_bits_.has_bits_[0]._0_1_ = (byte)request._has_bits_.has_bits_[0] | 2;
  if (request.compiler_version_ == (Version *)0x0) {
    request.compiler_version_ =
         Arena::CreateMaybeMessage<google::protobuf::compiler::Version>((Arena *)0x0);
  }
  pVVar4 = request.compiler_version_;
  (request.compiler_version_)->major_ = 3;
  (request.compiler_version_)->minor_ = 9;
  (request.compiler_version_)->patch_ = 1;
  *(byte *)((request.compiler_version_)->_has_bits_).has_bits_ =
       (byte)((request.compiler_version_)->_has_bits_).has_bits_[0] | 0xf;
  writer.impl_.end_ = writer.impl_.buffer_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&writer,"");
  internal::ArenaStringPtr::SetNoArena
            (&pVVar4->suffix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&writer);
  if (writer.impl_.end_ != writer.impl_.buffer_) {
    operator_delete(writer.impl_.end_);
  }
  Subprocess::Subprocess(&subprocess);
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->plugins_)._M_t,plugin_name);
  bVar11 = (_Rb_tree_header *)cVar7._M_node != &(this->plugins_)._M_t._M_impl.super__Rb_tree_header;
  arg9 = (SubstituteArg *)plugin_name;
  if (bVar11) {
    plugin_name = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->plugins_,plugin_name);
  }
  Subprocess::Start(&subprocess,plugin_name,(uint)bVar11);
  communicate_error._M_dataplus._M_p = (pointer)&communicate_error.field_2;
  communicate_error._M_string_length = 0;
  communicate_error.field_2._M_local_buf[0] = '\0';
  bVar11 = Subprocess::Communicate
                     (&subprocess,&request.super_Message,&response.super_Message,&communicate_error)
  ;
  if (bVar11) {
    if (response.file_.super_RepeatedPtrFieldBase.current_size_ < 1) {
      stream = (ZeroCopyOutputStream *)0x0;
    }
    else {
      lVar8 = 0;
      stream = (ZeroCopyOutputStream *)0x0;
      do {
        pvVar2 = (response.file_.super_RepeatedPtrFieldBase.rep_)->elements[lVar8];
        if (*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) == 0) {
          lVar9 = *(long *)((long)pvVar2 + 0x18);
          if (*(long *)(lVar9 + 8) == 0) {
            if (stream == (ZeroCopyOutputStream *)0x0) {
              writer.impl_.end_ = (uint8 *)arg9->text_;
              writer.impl_.buffer_end_._0_4_ = arg9->size_;
              local_60.text_ = (pointer)0x0;
              local_60.size_ = -1;
              local_90.text_ = (char *)0x0;
              local_90.size_ = -1;
              local_c0.text_ = (char *)0x0;
              local_c0.size_ = -1;
              local_f0.text_ = (char *)0x0;
              local_f0.size_ = -1;
              local_120.text_ = (char *)0x0;
              local_120.size_ = -1;
              local_150.text_ = (char *)0x0;
              local_150.size_ = -1;
              local_180.text_ = (char *)0x0;
              local_180.size_ = -1;
              local_1b0.text_ = (char *)0x0;
              local_1b0.size_ = -1;
              local_1e0.text_ = (char *)0x0;
              local_1e0.size_ = -1;
              strings::Substitute_abi_cxx11_
                        (&local_2c0,
                         (strings *)
                         "$0: First file chunk returned by plugin did not specify a file name.",
                         (char *)&writer,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                         &local_150,&local_180,&local_1b0,&local_1e0,arg9);
              std::__cxx11::string::operator=((string *)error,(string *)&local_2c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) goto LAB_0022c005;
              goto LAB_0022c00a;
            }
          }
          else {
            if (stream != (ZeroCopyOutputStream *)0x0) {
              (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
              lVar9 = *(long *)((long)pvVar2 + 0x18);
            }
            iVar5 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,lVar9);
            stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar5);
          }
        }
        else {
          writer.impl_.end_ = writer.impl_.buffer_;
          lVar9 = **(long **)((long)pvVar2 + 0x18);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&writer,lVar9,(*(long **)((long)pvVar2 + 0x18))[1] + lVar9);
          if (stream != (ZeroCopyOutputStream *)0x0) {
            (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
          }
          iVar5 = (*generator_context->_vptr_GeneratorContext[4])
                            (generator_context,&writer,*(undefined8 *)((long)pvVar2 + 0x20));
          stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
          if (writer.impl_.end_ != writer.impl_.buffer_) {
            operator_delete(writer.impl_.end_);
          }
        }
        io::CodedOutputStream::CodedOutputStream(&writer,stream,true);
        puVar3 = writer.cur_;
        data = (void *)**(undefined8 **)((long)pvVar2 + 0x28);
        iVar5 = (int)(*(undefined8 **)((long)pvVar2 + 0x28))[1];
        __n = (size_t)iVar5;
        if ((long)writer.impl_.end_ - (long)writer.cur_ < (long)__n) {
          writer.cur_ = io::EpsCopyOutputStream::WriteRawFallback
                                  (&writer.impl_,data,iVar5,writer.cur_);
        }
        else {
          memcpy(writer.cur_,data,__n);
          writer.cur_ = puVar3 + __n;
        }
        io::CodedOutputStream::~CodedOutputStream(&writer);
        lVar8 = lVar8 + 1;
      } while (lVar8 < response.file_.super_RepeatedPtrFieldBase.current_size_);
    }
    bVar11 = (response.error_.ptr_)->_M_string_length == 0;
    if (!bVar11) {
      std::__cxx11::string::_M_assign((string *)error);
    }
    if (stream != (ZeroCopyOutputStream *)0x0) {
      (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
    }
  }
  else {
    writer.impl_.end_ = (uint8 *)arg9->text_;
    writer.impl_.buffer_end_._0_4_ = arg9->size_;
    local_60.text_ = communicate_error._M_dataplus._M_p;
    local_60.size_ = (int)communicate_error._M_string_length;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_2c0,(strings *)"$0: $1",(char *)&writer,&local_60,&local_90,&local_c0,
               &local_f0,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,arg9);
    std::__cxx11::string::operator=((string *)error,(string *)&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
LAB_0022c005:
      operator_delete(local_2c0._M_dataplus._M_p);
    }
LAB_0022c00a:
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)communicate_error._M_dataplus._M_p != &communicate_error.field_2) {
    operator_delete(communicate_error._M_dataplus._M_p);
  }
  Subprocess::~Subprocess(&subprocess);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&already_seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)processed_parameter._M_dataplus._M_p != &processed_parameter.field_2) {
    operator_delete(processed_parameter._M_dataplus._M_p);
  }
  CodeGeneratorResponse::~CodeGeneratorResponse(&response);
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  return bVar11;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;


  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    request.add_file_to_generate(parsed_files[i]->name());
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name for plugins.
                              true,  // Include source code info.
                              &already_seen, request.mutable_proto_file());
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = strings::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); i++) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->OpenForInsert(
          filename, output_file.insertion_point()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == NULL) {
      *error = strings::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    return false;
  }

  return true;
}